

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelOverridesProperties,_1UL>::
         Construct(DB *db,LIST *params)

{
  IfcRelOverridesProperties *in;
  
  in = (IfcRelOverridesProperties *)operator_new(0x118);
  *(undefined ***)&in->field_0x100 = &PTR__Object_00836880;
  *(undefined8 *)&in->field_0x108 = 0;
  *(char **)&in->field_0x110 = "IfcRelOverridesProperties";
  Assimp::IFC::Schema_2x3::IfcRelDefinesByProperties::IfcRelDefinesByProperties
            ((IfcRelDefinesByProperties *)in,&PTR_construction_vtable_24__008c2068);
  *(undefined8 *)&(in->super_IfcRelDefinesByProperties).field_0xe0 = 0;
  *(undefined ***)&(in->super_IfcRelDefinesByProperties).super_IfcRelDefines =
       &PTR__IfcRelOverridesProperties_008c1f88;
  *(undefined ***)&in->field_0x100 = &PTR__IfcRelOverridesProperties_008c2050;
  *(undefined ***)&(in->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x88 =
       &PTR__IfcRelOverridesProperties_008c1fb0;
  (in->super_IfcRelDefinesByProperties).super_IfcRelDefines.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcRelOverridesProperties_008c1fd8;
  *(undefined ***)&(in->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0xc0 =
       &PTR__IfcRelOverridesProperties_008c2000;
  *(undefined ***)&(in->super_IfcRelDefinesByProperties).field_0xd8 =
       &PTR__IfcRelOverridesProperties_008c2028;
  *(undefined8 *)&(in->super_IfcRelDefinesByProperties).field_0xe8 = 0;
  *(undefined8 *)&in->field_0xf0 = 0;
  *(undefined8 *)&in->field_0xf8 = 0;
  GenericFill<Assimp::IFC::Schema_2x3::IfcRelOverridesProperties>(db,params,in);
  return (Object *)
         (&(in->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x0 +
         *(long *)(*(long *)&(in->super_IfcRelDefinesByProperties).super_IfcRelDefines + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }